

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_shader_stage_required_subgroup_size
          (Impl *this,Value *state,VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT **out_info
          )

{
  uint uVar1;
  VkPipelineShaderStageRequiredSubgroupSizeCreateInfo *pVVar2;
  Type this_00;
  VkPipelineShaderStageRequiredSubgroupSizeCreateInfo *info;
  VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT **out_info_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar2 = ScratchAllocator::allocate_cleared<VkPipelineShaderStageRequiredSubgroupSizeCreateInfo>
                     (&this->allocator);
  this_00 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ::operator[]<char_const>
                      ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        *)state,"requiredSubgroupSize");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(this_00);
  pVVar2->requiredSubgroupSize = uVar1;
  *out_info = pVVar2;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_shader_stage_required_subgroup_size(const Value &state,
                                                                    VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkPipelineShaderStageRequiredSubgroupSizeCreateInfoEXT>();

	info->requiredSubgroupSize = state["requiredSubgroupSize"].GetUint();

	*out_info = info;
	return true;
}